

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

void findScaleSpaceExtrema
               (vector<extrema,_std::allocator<extrema>_> *KP,
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               *dogScaleSpace,Mat *image,uint *cnt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  size_t sVar9;
  uint uVar10;
  pointer pdVar11;
  uint uVar12;
  pointer pdVar13;
  bool bVar14;
  long lVar15;
  long lVar16;
  ostream *poVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  pointer pvVar26;
  int iVar27;
  float s;
  float fVar28;
  float fVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [8];
  float in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  Matx<float,_3,_1> x;
  Matx31f dD2;
  Vec3f dD;
  double val;
  uint local_210;
  uint local_20c;
  undefined1 local_208 [8];
  pointer pdStack_200;
  pointer local_1f8;
  undefined1 local_1e8 [8];
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  ulong local_1d0;
  uint local_1c8;
  uint local_1c4;
  double local_1c0;
  long local_1b8;
  ulong local_1b0;
  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *local_1a8;
  long local_1a0;
  long local_198;
  uint local_190;
  uint local_18c;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  value_type local_178;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f0 [3];
  Matx<float,_3,_1> local_e4;
  vector<double,_std::allocator<double>_> local_d8;
  vector<extrema,_std::allocator<extrema>_> *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  uint *local_a0;
  double local_98;
  Point2f local_90;
  double local_88;
  Matx<float,_3,_3> local_7c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_1c4 = 0;
  local_108 = (dogScaleSpace->
              super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  uVar18 = 0;
  local_1a8 = dogScaleSpace;
  local_c0 = KP;
  local_a0 = cnt;
  do {
    uVar12 = local_1c4;
    local_20c = 1;
    iVar25 = (int)uVar18;
    lVar15 = *(long *)&local_108[uVar18].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                       _M_impl.super__Vector_impl_data;
    if (((long)*(pointer *)
                ((long)&local_108[uVar18].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                        _M_impl.super__Vector_impl_data + 8) - lVar15 >> 5) * -0x5555555555555555 -
        3U < 0xfffffffffffffffe) {
      local_1d0 = 1;
      do {
        uVar10 = local_20c;
        local_210 = 5;
        local_188 = local_1d0;
        if (*(int *)(lVar15 + 8 + local_1d0 * 0x60) - 0xbU < 0xfffffffa) {
          do {
            local_1c8 = 5;
            local_1b0 = local_188 & 0xffffffff;
            local_1d0 = local_188;
            local_190 = local_210;
            if (*(int *)(lVar15 + 0xc + local_1b0 * 0x60) - 0xbU < 0xfffffffa) {
              lVar15 = lVar15 + local_1b0 * 0x60;
              pvVar26 = local_108 + uVar18;
              local_1b8 = (long)(int)local_210;
              local_198 = (long)(int)(local_210 + 1);
              local_1a0 = (long)(int)(local_210 - 1);
              local_58 = ZEXT416(local_210);
              do {
                uVar4 = local_1c8;
                local_1e8._0_4_ = (int)uVar18;
                *local_a0 = *local_a0 + 1;
                local_1c0 = (double)(long)(int)local_1c8;
                local_88 = (double)*(byte *)((long)local_1c0 +
                                            **(long **)(lVar15 + 0x48) * local_1b8 +
                                            *(long *)(lVar15 + 0x10));
                local_178.octave = 9.0;
                bVar14 = findExtrema(local_1a8,&local_88,&local_1c4,&local_20c,&local_210,&local_1c8
                                     ,&local_178.octave);
                if (bVar14) {
                  local_178.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_178.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_178.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_178.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_178.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_178.octave = (double)(uint)local_1e8._0_4_;
                  local_178.NeighborCells.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_178.layer = (int)local_188;
                  local_b0 = *(long *)&(pvVar26->
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                                       _M_impl.super__Vector_impl_data;
                  local_a8 = local_1b0 * 0x60;
                  uVar2 = *(undefined8 *)(local_b0 + 8 + local_a8);
                  auVar32._0_8_ = (double)(int)uVar2;
                  auVar32._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
                  auVar31._0_8_ = (double)((ulong)uVar4 | 0x4330000000000000) - 4503599627370496.0;
                  auVar31._8_8_ = (double)(local_58._0_8_ | 0x4330000000000000) - 4503599627370496.0
                  ;
                  uVar1 = image->rows;
                  uVar3 = image->cols;
                  auVar31 = divpd(auVar31,auVar32);
                  local_178.pt.x = (float)((double)(int)uVar1 * auVar31._0_8_);
                  local_178.pt.y = (float)((double)(int)uVar3 * auVar31._8_8_);
                  local_1d0 = (ulong)(local_178.layer - 1) * 0x60;
                  local_18c = uVar4 + 1;
                  lVar15 = *(long *)(local_b0 + 0x10 + local_a8);
                  lVar5 = **(long **)(local_b0 + 0x48 + local_a8);
                  lVar23 = lVar5 * local_1b8 + lVar15;
                  uVar18 = (ulong)(int)local_18c;
                  lVar19 = (long)(int)(uVar4 - 1);
                  lVar21 = lVar5 * local_198 + lVar15;
                  lVar15 = lVar5 * local_1a0 + lVar15;
                  local_b8 = (ulong)(local_178.layer + 1) * 0x60;
                  lVar5 = *(long *)(local_b0 + 0x10 + local_b8);
                  lVar16 = **(long **)(local_b0 + 0x48 + local_b8);
                  lVar22 = lVar16 * local_1b8 + lVar5;
                  lVar6 = **(long **)(local_b0 + 0x48 + local_1d0);
                  lVar7 = *(long *)(local_b0 + 0x10 + local_1d0);
                  lVar24 = lVar6 * local_1b8 + lVar7;
                  local_e4.val[0] =
                       (float)(int)((uint)*(byte *)(uVar18 + lVar23) -
                                   (uint)*(byte *)(lVar19 + lVar23)) * 0.0019607844;
                  local_e4.val[1] =
                       (float)(int)((uint)*(byte *)((long)local_1c0 + lVar21) -
                                   (uint)*(byte *)((long)local_1c0 + lVar15)) * 0.0019607844;
                  local_e4.val[2] =
                       (float)(int)((uint)*(byte *)((long)local_1c0 + lVar22) -
                                   (uint)*(byte *)((long)local_1c0 + lVar24)) * 0.0019607844;
                  fVar28 = (float)*(byte *)((long)local_1c0 + lVar23) +
                           (float)*(byte *)((long)local_1c0 + lVar23);
                  local_7c.val[0] =
                       ((float)((uint)*(byte *)(lVar19 + lVar23) + (uint)*(byte *)(uVar18 + lVar23))
                       - fVar28) * 0.003921569;
                  local_7c.val[8] =
                       ((float)((uint)*(byte *)((long)local_1c0 + lVar24) +
                               (uint)*(byte *)((long)local_1c0 + lVar22)) - fVar28) * 0.003921569;
                  local_1e8._4_4_ = in_XMM5_Db;
                  local_1e8._0_4_ = local_7c.val[0];
                  uStack_1e0 = in_XMM5_Dc;
                  uStack_1dc = in_XMM5_Dd;
                  local_7c.val[2] =
                       (float)(int)((uint)*(byte *)(lVar19 + lVar24) +
                                   ((uint)*(byte *)(uVar18 + lVar22) -
                                   ((uint)*(byte *)(uVar18 + lVar24) +
                                   (uint)*(byte *)(lVar19 + lVar22)))) * 0.0009803922;
                  local_7c.val[1] =
                       (float)(int)((uint)*(byte *)(lVar19 + lVar15) +
                                   ((uint)*(byte *)(uVar18 + lVar21) -
                                   ((uint)*(byte *)(uVar18 + lVar15) +
                                   (uint)*(byte *)(lVar19 + lVar21)))) * 0.0009803922;
                  fStack_180 = ((float)((uint)*(byte *)((long)local_1c0 + lVar15) +
                                       (uint)*(byte *)((long)local_1c0 + lVar21)) - fVar28) *
                               0.003921569;
                  fStack_17c = (float)(int)((uint)*(byte *)((long)local_1c0 +
                                                           lVar6 * local_1a0 + lVar7) +
                                           ((uint)*(byte *)((long)local_1c0 +
                                                           lVar16 * local_198 + lVar5) -
                                           ((uint)*(byte *)((long)local_1c0 +
                                                           lVar6 * local_198 + lVar7) +
                                           (uint)*(byte *)((long)local_1c0 +
                                                          lVar16 * local_1a0 + lVar5)))) *
                               0.0009803922;
                  local_188 = CONCAT44(local_7c.val[1],local_7c.val[2]);
                  local_7c.val[7] = fStack_17c;
                  local_7c.val[6] = local_7c.val[2];
                  local_208 = (undefined1  [8])0x0;
                  pdStack_200 = (pointer)((ulong)pdStack_200 & 0xffffffff00000000);
                  local_1b0 = lVar19;
                  local_108 = (pointer)uVar18;
                  local_7c.val[3] = local_7c.val[1];
                  local_7c.val[4] = fStack_180;
                  local_7c.val[5] = fStack_17c;
                  local_48 = local_7c.val[1];
                  fStack_44 = local_7c.val[1];
                  fStack_40 = local_7c.val[1];
                  fStack_3c = local_7c.val[1];
                  bVar14 = cv::internal::Matx_FastSolveOp<float,_3,_3,_1>::operator()
                                     ((Matx_FastSolveOp<float,_3,_3,_1> *)&local_d8,&local_7c,
                                      &local_e4,(Matx<float,_3,_1> *)local_208,0);
                  auVar33 = local_208;
                  if (!bVar14) {
                    auVar33 = (undefined1  [8])(pointer)0x0;
                  }
                  fVar28 = (float)((ulong)auVar33 >> 0x20);
                  if (((bVar14 && 0.5 <= ABS(pdStack_200._0_4_)) || (0.5 <= ABS(fVar28))) ||
                     (0.5 <= ABS(SUB84(auVar33,0)))) {
                    if (bVar14) {
                      fVar29 = -pdStack_200._0_4_;
                    }
                    else {
                      fVar29 = -0.0;
                    }
                    in_XMM5_Dd = 0x80000000;
                    in_XMM5_Dc = 0x80000000;
                    in_XMM5_Db = -fVar28;
                    lVar15 = *(long *)(local_a8 + local_b0 + 0x10);
                    lVar5 = **(long **)(local_a8 + local_b0 + 0x48);
                    lVar16 = lVar5 * local_1b8 + lVar15;
                    local_f0[0] = (float)(int)((uint)*(byte *)(uVar18 + lVar16) -
                                              (uint)*(byte *)(lVar19 + lVar16)) * 0.0019607844;
                    local_f0[1] = (float)(int)((uint)*(byte *)((long)local_1c0 +
                                                              lVar5 * local_198 + lVar15) -
                                              (uint)*(byte *)((long)local_1c0 +
                                                             lVar5 * local_1a0 + lVar15)) *
                                  0.0019607844;
                    local_f0[2] = (float)(int)((uint)*(byte *)((long)local_1c0 +
                                                              **(long **)(local_b8 + local_b0 + 0x48
                                                                         ) * local_1b8 +
                                                              *(long *)(local_b8 + local_b0 + 0x10))
                                              - (uint)*(byte *)((long)local_1c0 +
                                                               **(long **)(local_1d0 + local_b0 +
                                                                          0x48) * local_1b8 +
                                                               *(long *)(local_1d0 + local_b0 + 0x10
                                                                        ))) * 0.0019607844;
                    local_108 = (pointer)((ulong)auVar33 ^ 0x8000000080000000);
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_208 = (undefined1  [8])((ulong)auVar33 ^ 0x8000000080000000);
                    pdStack_200 = (pointer)CONCAT44(pdStack_200._4_4_,fVar29);
                    fVar28 = 0.0;
                    lVar15 = 0;
                    do {
                      fVar28 = fVar28 + local_f0[lVar15] * *(float *)(local_208 + lVar15 * 4);
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 3);
                    dVar30 = (double)(ABS((float)*(byte *)(lVar16 + (long)local_1c0) * 0.003921569 +
                                          fVar28 * 0.5) * 5.0);
                    if (0.03 <= dVar30) {
                      poVar17 = std::ostream::_M_insert<double>(dVar30);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) +
                                      (char)poVar17);
                      std::ostream::put((char)poVar17);
                      std::ostream::flush();
                      fVar28 = (float)local_1e8._0_4_ * fStack_180 - local_48 * local_48;
                      if ((0.0 < fVar28) &&
                         (((float)local_1e8._0_4_ + fStack_180) *
                          ((float)local_1e8._0_4_ + fStack_180) * 10.0 < fVar28 * 121.0)) {
                        fVar28 = local_178.pt.y;
                        local_178.pt.x = local_178.pt.x + (float)(int)ROUND((float)local_108);
                        local_178.pt.y = fVar28 + (float)(int)ROUND(local_108._4_4_);
                        std::vector<double,_std::allocator<double>_>::resize
                                  (&local_178.keypoint_bin,0x24);
                        std::vector<double,_std::allocator<double>_>::resize(&local_178.cell_bin,8);
                        puVar8 = image->data;
                        sVar9 = *(image->step).p;
                        local_1e8 = (undefined1  [8])
                                    ((double)puVar8[(long)(int)(local_178.pt.x + 1.0) +
                                                    (long)(int)local_178.pt.y * sVar9] -
                                    (double)puVar8[(long)(int)(local_178.pt.x + -1.0) +
                                                   (long)(int)local_178.pt.y * sVar9]);
                        local_1c0 = (double)puVar8[(long)(int)local_178.pt.x +
                                                   (long)(int)(local_178.pt.y + 1.0) * sVar9] -
                                    (double)puVar8[(long)(int)local_178.pt.x +
                                                   (long)(int)(local_178.pt.y + -1.0) * sVar9];
                        local_178.angle =
                             calAngle((double)puVar8[(long)(int)(local_178.pt.x + 1.0) +
                                                     (long)(int)local_178.pt.y * sVar9] -
                                      (double)puVar8[(long)(int)(local_178.pt.x + -1.0) +
                                                     (long)(int)local_178.pt.y * sVar9],local_1c0);
                        local_178.magnitude =
                             pow((double)local_1e8 * (double)local_1e8 + local_1c0 * local_1c0,0.5);
                        dVar30 = exp2((double)(local_178.layer + -1) * 0.5 + local_178.octave);
                        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)(dVar30 * 1.5);
                        keypoint_Orientation
                                  ((vector<double,_std::allocator<double>_> *)local_208,image,
                                   &local_178.pt,(double *)&local_d8);
                        pdVar13 = local_178.keypoint_bin.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage;
                        pdVar11 = local_178.keypoint_bin.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)local_208;
                        local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish = pdStack_200;
                        local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = local_1f8;
                        if (pdVar11 != (pointer)0x0) {
                          operator_delete(pdVar11,(long)pdVar13 - (long)pdVar11);
                        }
                        iVar25 = 0;
                        do {
                          _local_1e8 = ZEXT416((uint)(float)(iVar25 * 4));
                          iVar27 = 0;
                          do {
                            local_208 = (undefined1  [8])0x0;
                            pdStack_200 = (pointer)0x0;
                            local_1f8 = (pointer)0x0;
                            local_90.x = local_178.pt.x + (float)(iVar27 * 4) + -7.0;
                            local_90.y = local_178.pt.y + (float)local_1e8._0_4_ + -7.0;
                            if ((long)local_178.keypoint_bin.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)local_178.keypoint_bin.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start == 0) {
                              local_98 = 0.0;
                            }
                            else {
                              lVar15 = (long)local_178.keypoint_bin.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_178.keypoint_bin.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 3;
                              uVar20 = 0;
                              uVar18 = 0;
                              dVar30 = 1e-08;
                              do {
                                if (dVar30 < local_178.keypoint_bin.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar20]) {
                                  uVar18 = uVar20 & 0xffffffff;
                                  dVar30 = local_178.keypoint_bin.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar20];
                                }
                                uVar20 = uVar20 + 1;
                              } while (lVar15 + (ulong)(lVar15 == 0) != uVar20);
                              local_98 = (double)((int)uVar18 * 10);
                            }
                            calcOrientationHist(&local_d8,image,&local_90,&local_178.pt,&local_98);
                            pdVar11 = local_1f8;
                            auVar33 = local_208;
                            local_208 = (undefined1  [8])
                                        local_d8.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            pdStack_200 = local_d8.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish;
                            local_1f8 = local_d8.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            if (auVar33 != (undefined1  [8])0x0) {
                              operator_delete((void *)auVar33,(long)pdVar11 - (long)auVar33);
                            }
                            std::
                            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ::push_back(&local_178.NeighborCells,
                                        (vector<double,_std::allocator<double>_> *)local_208);
                            if (local_208 != (undefined1  [8])0x0) {
                              operator_delete((void *)local_208,(long)local_1f8 - (long)local_208);
                            }
                            iVar27 = iVar27 + 1;
                          } while (iVar27 != 4);
                          iVar25 = iVar25 + 1;
                        } while (iVar25 != 4);
                        std::vector<extrema,_std::allocator<extrema>_>::push_back
                                  (local_c0,&local_178);
                        std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::~vector(&local_178.NeighborCells);
                        if (local_178.cell_bin.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_178.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_178.cell_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_178.cell_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_178.keypoint_bin.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_178.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_178.keypoint_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_178.keypoint_bin.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        local_108 = (local_1a8->
                                    super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                        local_1d0 = (ulong)uVar10;
                        local_188 = (ulong)uVar10;
                        local_1c8 = local_18c;
                        uVar4 = uVar12;
                        goto LAB_0010662b;
                      }
                    }
                  }
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::~vector(&local_178.NeighborCells);
                  if (local_178.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_178.cell_bin.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_178.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_178.cell_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_178.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_178.keypoint_bin.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_178.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_178.keypoint_bin.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  local_108 = (local_1a8->
                              super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                  uVar18 = (ulong)uVar12;
                  local_1d0 = (ulong)uVar10;
                  break;
                }
                local_1c8 = uVar4 + 1;
                uVar4 = local_1e8._0_4_;
LAB_0010662b:
                uVar18 = (ulong)uVar4;
                pvVar26 = local_108 + uVar18;
                local_1b0 = local_188 & 0xffffffff;
                lVar5 = *(long *)&(pvVar26->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                                  _M_impl.super__Vector_impl_data;
                lVar15 = lVar5 + local_1b0 * 0x60;
              } while (local_1c8 < *(int *)(lVar5 + 0xc + local_1b0 * 0x60) - 5U);
            }
            local_210 = local_190 + 1;
            lVar15 = *(long *)&local_108[uVar18].
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data;
            local_188 = local_1d0;
          } while (local_210 < *(int *)(lVar15 + 8 + (local_1d0 & 0xffffffff) * 0x60) - 5U);
        }
        iVar25 = (int)uVar18;
        local_20c = (int)local_1d0 + 1;
        local_1d0 = (ulong)local_20c;
        lVar15 = *(long *)&local_108[uVar18].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                           _M_impl.super__Vector_impl_data;
      } while (local_1d0 <
               ((long)*(pointer *)
                       ((long)&local_108[uVar18].
                               super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar15 >> 5) * -0x5555555555555555 -
               1U);
    }
    local_1c4 = iVar25 + 1;
    uVar18 = (ulong)local_1c4;
    if (3 < local_1c4) {
      return;
    }
  } while( true );
}

Assistant:

void findScaleSpaceExtrema(vector<extrema>& KP, const vector<vector<Mat> >& dogScaleSpace, const Mat& image, unsigned& cnt){
    for(unsigned i = 0; i < octave; i++){
        for(unsigned j = 1; j < dogScaleSpace[i].size()-1; j++){
            for(unsigned r = border; r < dogScaleSpace[i][j].rows-border; r++){
                for(unsigned c = border; c < dogScaleSpace[i][j].cols-border; c++){
                    cnt ++;
                    double val = (double)dogScaleSpace[i][j].at<uchar>(r,c);
                    if( findExtrema(dogScaleSpace, val, i, j, r, c, thres)){
                        extrema tmpKp;
                        double tangentR, tangentC, angle;
                        tmpKp.octave = i;
                        tmpKp.layer = j;
                        const Mat& img = dogScaleSpace[i][j];
                        // tmpKp.pt.y = r / (double)img.cols * (double)image.cols;
                        // tmpKp.pt.x = c / (double)img.rows * (double)image.rows;
                        tmpKp.pt = Point2f (c / (double)img.rows * (double)image.rows, r / (double)img.cols * (double)image.cols);

////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        const float img_scale = 1.f/(255);
                        const float deriv_scale = img_scale*0.5f;
                        const float second_deriv_scale = img_scale;
                        const float cross_deriv_scale = img_scale*0.25f;

                        const Mat& prev = dogScaleSpace[i][j-1];
                        const Mat& next = dogScaleSpace[i][j+1];
                        float xi, xr, xc, contr;

                        Vec3f dD((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        
                        float v2 = (float)img.at<uchar>(r, c)*2;
                        float dxx = (img.at<uchar>(r, c+1) + img.at<uchar>(r, c-1) - v2)*second_deriv_scale;
                        float dyy = (img.at<uchar>(r+1, c) + img.at<uchar>(r-1, c) - v2)*second_deriv_scale;
                        float dss = (next.at<uchar>(r, c) + prev.at<uchar>(r, c) - v2)*second_deriv_scale;
                        float dxy = (img.at<uchar>(r+1, c+1) - img.at<uchar>(r+1, c-1) -
                                    img.at<uchar>(r-1, c+1) + img.at<uchar>(r-1, c-1))*cross_deriv_scale;
                        float dxs = (next.at<uchar>(r, c+1) - next.at<uchar>(r, c-1) -
                                    prev.at<uchar>(r, c+1) + prev.at<uchar>(r, c-1))*cross_deriv_scale;
                        float dys = (next.at<uchar>(r+1, c) - next.at<uchar>(r-1, c) -
                                    prev.at<uchar>(r+1, c) + prev.at<uchar>(r-1, c))*cross_deriv_scale;
                        
                        Matx33f H(dxx, dxy, dxs,
                                  dxy, dyy, dys,
                                  dxs, dys, dss);

                        Vec3f X = H.solve(dD, DECOMP_LU);

                        xi = -X[2];
                        xr = -X[1];
                        xc = -X[0];

                        if( std::abs(xi) < 0.5f && std::abs(xr) < 0.5f && std::abs(xc) < 0.5f )
                            break;
                        
                        Matx31f dD2((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                   (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                   (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        float t = dD2.dot(Matx31f(xc, xr, xi));
                        contr = img.at<uchar>(r,c)*img_scale + t*0.5f;
                        if( abs( contr ) * octaveLayer < 0.03 )
                            break;
                        cout << abs( contr ) * octaveLayer << endl;
                        
                        double edgeThreshold = 10.0;
                        float tr = dxx + dyy;
                        float det = dxx * dyy - dxy * dxy;
                        if( det <= 0 || tr*tr*edgeThreshold >= (edgeThreshold + 1)*(edgeThreshold + 1)*det )
                            break;

                        // cout << xi << "  "<< xr << "  "<< xc <<endl;
                        // if(std::abs(xi) > 1 || std::abs(xr) > 1 || std::abs(xc) < 1)
                        //     break;
                        tmpKp.pt.x += cvRound(xc);
                        tmpKp.pt.y += cvRound(xr);
////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        tmpKp.keypoint_bin.resize(36);
                        tmpKp.cell_bin.resize(8);
                        tangentC = (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x+1) - (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x-1);
                        tangentR = (double)image.at<uchar>(tmpKp.pt.y+1, tmpKp.pt.x) - (double)image.at<uchar>(tmpKp.pt.y-1, tmpKp.pt.x);
                        angle = calAngle(tangentC, tangentR);
                        tmpKp.angle = angle;
                        tmpKp.magnitude = pow(tangentC * tangentC + tangentR * tangentR, 0.5);
                        tmpKp.keypoint_bin = keypoint_Orientation(image, tmpKp.pt, 1.5 * pow(2,(tmpKp.layer-1)/2.0 + tmpKp.octave));

                        for(unsigned row_cell = 0; row_cell < block_width; row_cell++){
                            for(unsigned col_cell = 0; col_cell < block_width; col_cell++){
                                vector<double> tmpCell;
                                tmpCell = calcOrientationHist(image, Point2f(tmpKp.pt.x + col_cell*block_width - 7, tmpKp.pt.y + row_cell*block_width - 7),
                                                                tmpKp.pt, Max(tmpKp.keypoint_bin).second * 10);
                                tmpKp.NeighborCells.push_back(tmpCell);
                            }
                        }
                        KP.push_back(tmpKp);
                    }
                }
            }
        }
    }
}